

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstring.cpp
# Opt level: O3

char * T_CString_toLowerCase_63(char *str)

{
  byte bVar1;
  char *pcVar2;
  byte bVar3;
  char *origPtr;
  
  pcVar2 = str;
  if (str != (char *)0x0) {
    do {
      bVar1 = *str;
      bVar3 = bVar1 | 0x20;
      if (0x19 < (byte)(bVar1 + 0xbf)) {
        bVar3 = bVar1;
      }
      *str = bVar3;
      str = (char *)((byte *)str + 1);
    } while (bVar3 != 0);
  }
  return pcVar2;
}

Assistant:

U_CAPI char* U_EXPORT2
T_CString_toLowerCase(char* str)
{
    char* origPtr = str;

    if (str) {
        do
            *str = (char)uprv_tolower(*str);
        while (*(str++));
    }

    return origPtr;
}